

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O2

Entry * array_new<Lib::DHMap<std::pair<unsigned_int,unsigned_int>,Kernel::Term*,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
                  (void *placement,size_t length)

{
  Entry *pEVar1;
  Entry *res;
  bool bVar2;
  
  pEVar1 = (Entry *)placement;
  while (bVar2 = length != 0, length = length - 1, bVar2) {
    *(undefined8 *)placement = 0;
    *(undefined4 *)((long)placement + 8) = 0;
    placement = (void *)((long)placement + 0x18);
  }
  return pEVar1;
}

Assistant:

T* array_new(void* placement, size_t length)
{
  ASS_NEQ(placement,0);
  ASS_G(length,0);

  T* res=static_cast<T*>(placement);
  T* p=res;
  while(length--) {
    ::new(static_cast<void*>(p++)) T();
  }
  return res;
}